

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_grids_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::GridMeshNode> *gmesh)

{
  uint uVar1;
  pointer pGVar2;
  QuadMeshNode *pQVar3;
  Node *pNVar4;
  Ref<embree::SceneGraph::GridMeshNode> *pRVar5;
  int iVar6;
  uint uVar7;
  QuadMeshNode *this_00;
  GridMeshNode *pGVar8;
  undefined4 extraout_var;
  ulong uVar9;
  long lVar10;
  int iVar11;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_01;
  long lVar12;
  uint y;
  bool bVar13;
  Ref<embree::SceneGraph::MaterialNode> local_78;
  int local_6c;
  int local_68;
  uint local_64;
  QuadMeshNode *local_60;
  Quad local_58;
  Node *local_48;
  Ref<embree::SceneGraph::GridMeshNode> *local_40;
  ulong local_38;
  
  this_00 = (QuadMeshNode *)::operator_new(0xd8);
  pGVar8 = gmesh->ptr;
  local_78.ptr = (pGVar8->material).ptr;
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    pGVar8 = gmesh->ptr;
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_78,pGVar8->time_range,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_48 = (Node *)this;
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar9 = 0;
  local_60 = this_00;
  local_40 = gmesh;
  while( true ) {
    pRVar5 = local_40;
    iVar6 = (*(local_40->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
    pQVar3 = local_60;
    pGVar8 = pRVar5->ptr;
    if (CONCAT44(extraout_var,iVar6) <= uVar9) break;
    pGVar2 = (pGVar8->grids).
             super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_64 = pGVar2[uVar9].startVtx;
    uVar1 = pGVar2[uVar9].lineStride;
    local_6c = pGVar2[uVar9].resY - 1;
    local_68 = pGVar2[uVar9].resX - 1;
    iVar6 = 0;
    local_38 = uVar9;
    while( true ) {
      uVar7 = local_64;
      iVar11 = local_68;
      if (iVar6 == local_6c) break;
      while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
        local_58.v3 = uVar1 + uVar7;
        local_58.v2 = uVar1 + uVar7 + 1;
        local_58.v0 = uVar7;
        local_58.v1 = uVar7 + 1;
        std::
        vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
        ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(&this_00->quads,&local_58);
        uVar7 = uVar7 + 1;
      }
      iVar6 = iVar6 + 1;
      local_64 = local_64 + uVar1;
    }
    uVar9 = local_38 + 1;
  }
  lVar10 = (long)(pGVar8->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pGVar8->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  this_01 = &local_60->positions;
  lVar12 = 0;
  while (pNVar4 = local_48, bVar13 = lVar10 != 0, lVar10 = lVar10 + -1, bVar13) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(this_01,(value_type *)
                        (&((pRVar5->ptr->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar12));
    lVar12 = lVar12 + 0x20;
  }
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)pQVar3;
  (*(pQVar3->super_Node).super_RefCount._vptr_RefCount[2])(pQVar3);
  (*(pQVar3->super_Node).super_RefCount._vptr_RefCount[3])(pQVar3);
  return (Ref<embree::SceneGraph::Node>)pNVar4;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_grids_to_quads ( Ref<SceneGraph::GridMeshNode> gmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(gmesh->material,gmesh->time_range,0);

    for (size_t i=0; i<gmesh->numPrimitives(); i++)
    {
      const unsigned int startVtx = gmesh->grids[i].startVtx;
      const unsigned int lineStride = gmesh->grids[i].lineStride;
      const unsigned int resX = gmesh->grids[i].resX;
      const unsigned int resY = gmesh->grids[i].resY;

      for (unsigned int y=0; y<resY-1; y++)
      {
        for (unsigned int x=0; x<resX-1; x++)
        {
          const unsigned int a0 = startVtx + y * lineStride + x;
          const unsigned int a1 = a0 + 1;
          const unsigned int a3 = a0 + lineStride;
          const unsigned int a2 = a0 + lineStride + 1;
          qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a3));
        }
      }
    }
    const size_t timeSteps = gmesh->positions.size();
    for (size_t t=0;t<timeSteps;t++)
      qmesh->positions.push_back(gmesh->positions[t]);
    return qmesh.dynamicCast<SceneGraph::Node>();
  }